

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Gia_Man_t * Jf_ManDeriveCnfMiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  Pars.pTimesReq._4_4_ = fVerbose;
  Jf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Pars.fCutMin = 1;
  Pars.fFuncDsd = 0;
  Pars.fGenCnf = 1;
  Pars.fCutHashing = Pars.pTimesReq._4_4_;
  pGVar1 = Jf_ManPerformMapping(p,(Jf_Par_t *)&pPars);
  return pGVar1;
}

Assistant:

Gia_Man_t * Jf_ManDeriveCnfMiter( Gia_Man_t * p, int fVerbose )
{
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->fGenCnf = 1;
    pPars->fCnfObjIds = 0;
    pPars->fAddOrCla = 1;
    pPars->fVerbose = fVerbose;
    return Jf_ManPerformMapping( p, pPars );
}